

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

void predict(svm_params *params,single_learner *param_2,example *ec)

{
  flat_example *__src;
  svm_example *this;
  float score;
  svm_example *sec;
  float local_34;
  svm_example *local_30;
  
  __src = flatten_sort_example(params->all,ec);
  if (__src != (flat_example *)0x0) {
    this = calloc_or_throw<svm_example>(1);
    local_30 = this;
    memcpy(&this->ex,__src,200);
    free(__src);
    predict(params,&local_30,&local_34,1);
    (ec->pred).scalar = local_34;
    svm_example::~svm_example(this);
    free(this);
  }
  return;
}

Assistant:

void predict(svm_params& params, single_learner&, example& ec)
{
  flat_example* fec = flatten_sort_example(*(params.all), &ec);
  if (fec)
  {
    svm_example* sec = &calloc_or_throw<svm_example>();
    sec->init_svm_example(fec);
    float score;
    predict(params, &sec, &score, 1);
    ec.pred.scalar = score;
    sec->~svm_example();
    free(sec);
  }
}